

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O0

void duckdb::StringVector::AddHandle(Vector *vector,BufferHandle *handle)

{
  BufferHandle *in_RSI;
  Vector *in_stack_00000020;
  VectorStringBuffer *string_buffer;
  VectorStringBuffer *this;
  VectorStringBuffer *local_18;
  
  local_18 = GetStringBuffer(in_stack_00000020);
  this = (VectorStringBuffer *)&stack0xffffffffffffffc8;
  make_buffer<duckdb::ManagedVectorBuffer,duckdb::BufferHandle>(in_RSI);
  shared_ptr<duckdb::VectorBuffer,_true>::shared_ptr<duckdb::ManagedVectorBuffer,_0>
            ((shared_ptr<duckdb::VectorBuffer,_true> *)this,
             (shared_ptr<duckdb::ManagedVectorBuffer,_true> *)in_RSI);
  VectorStringBuffer::AddHeapReference(this,(buffer_ptr<VectorBuffer> *)in_RSI);
  shared_ptr<duckdb::VectorBuffer,_true>::~shared_ptr
            ((shared_ptr<duckdb::VectorBuffer,_true> *)0x3e4edd);
  shared_ptr<duckdb::ManagedVectorBuffer,_true>::~shared_ptr
            ((shared_ptr<duckdb::ManagedVectorBuffer,_true> *)0x3e4ee7);
  return;
}

Assistant:

void StringVector::AddHandle(Vector &vector, BufferHandle handle) {
	auto &string_buffer = GetStringBuffer(vector);
	string_buffer.AddHeapReference(make_buffer<ManagedVectorBuffer>(std::move(handle)));
}